

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O3

void __thiscall
cbtAxisSweep3Internal<unsigned_short>::setAabb
          (cbtAxisSweep3Internal<unsigned_short> *this,cbtBroadphaseProxy *proxy,cbtVector3 *aabbMin
          ,cbtVector3 *aabbMax,cbtDispatcher *dispatcher)

{
  cbtDbvtBroadphase *pcVar1;
  undefined8 uVar2;
  
  uVar2 = *(undefined8 *)(aabbMin->m_floats + 2);
  *(undefined8 *)(proxy->m_aabbMin).m_floats = *(undefined8 *)aabbMin->m_floats;
  *(undefined8 *)((proxy->m_aabbMin).m_floats + 2) = uVar2;
  uVar2 = *(undefined8 *)(aabbMax->m_floats + 2);
  *(undefined8 *)(proxy->m_aabbMax).m_floats = *(undefined8 *)aabbMax->m_floats;
  *(undefined8 *)((proxy->m_aabbMax).m_floats + 2) = uVar2;
  updateHandle(this,(unsigned_short)proxy->m_uniqueId,aabbMin,aabbMax,dispatcher);
  pcVar1 = this->m_raycastAccelerator;
  if (pcVar1 != (cbtDbvtBroadphase *)0x0) {
    uVar2._0_4_ = proxy[1].m_collisionFilterGroup;
    uVar2._4_4_ = proxy[1].m_collisionFilterMask;
    (*(pcVar1->super_cbtBroadphaseInterface)._vptr_cbtBroadphaseInterface[4])
              (pcVar1,uVar2,aabbMin,aabbMax,dispatcher);
    return;
  }
  return;
}

Assistant:

void cbtAxisSweep3Internal<BP_FP_INT_TYPE>::setAabb(cbtBroadphaseProxy* proxy, const cbtVector3& aabbMin, const cbtVector3& aabbMax, cbtDispatcher* dispatcher)
{
	Handle* handle = static_cast<Handle*>(proxy);
	handle->m_aabbMin = aabbMin;
	handle->m_aabbMax = aabbMax;
	updateHandle(static_cast<BP_FP_INT_TYPE>(handle->m_uniqueId), aabbMin, aabbMax, dispatcher);
	if (m_raycastAccelerator)
		m_raycastAccelerator->setAabb(handle->m_dbvtProxy, aabbMin, aabbMax, dispatcher);
}